

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectRestraint.cpp
# Opt level: O0

void __thiscall
OpenMD::ObjectRestraint::calcForce(ObjectRestraint *this,Vector3d *struc,RotMat3x3d *A)

{
  mapped_type *pmVar1;
  double *in_RDX;
  double *in_RDI;
  pair<double,_double> pVar2;
  pair<double,_double> pVar3;
  pair<double,_double> pVar4;
  Vector3d tLab;
  RealType dVdswingY;
  RealType dSwingY;
  RealType dVdswingX;
  RealType dSwingX;
  RealType dVdtwist;
  RealType dTwist;
  Vector3d tSwing;
  Vector3d tTwist;
  RealType p;
  RealType swingY;
  RealType swingX;
  RealType twistAngle;
  Quat4d quat;
  RotMat3x3d temp;
  Vector3d tBody;
  Vector<double,_3U> *in_stack_fffffffffffffcc8;
  mapped_type *in_stack_fffffffffffffcd0;
  Vector<double,_3U> *in_stack_fffffffffffffcd8;
  double in_stack_fffffffffffffcf0;
  SquareMatrix3<double> *in_stack_fffffffffffffcf8;
  SquareMatrix3<double> *in_stack_fffffffffffffd00;
  SquareMatrix3<double> *in_stack_fffffffffffffd08;
  double in_stack_fffffffffffffd10;
  double *in_stack_fffffffffffffd38;
  Quaternion<double> *in_stack_fffffffffffffd40;
  SquareMatrix3<double> *in_stack_fffffffffffffd88;
  double local_230;
  Vector3d *in_stack_fffffffffffffdd8;
  ObjectRestraint *in_stack_fffffffffffffde0;
  pair<double,_double> local_1f0 [2];
  double local_1c8;
  double local_1c0;
  undefined4 local_1b4;
  pair<double,_double> local_1b0 [2];
  double local_188;
  double local_180;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_68;
  Vector<double,_3U> local_60 [4];
  
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffcd0,
             (Vector3<double> *)in_stack_fffffffffffffcc8);
  calcForce(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  if (3 < *(int *)((long)in_RDI + 100)) {
    local_68 = 0.0;
    Vector<double,_3U>::Vector(local_60,&local_68);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8)
    ;
    SquareMatrix3<double>::transpose(in_stack_fffffffffffffcf8);
    OpenMD::operator*(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2db67b);
    SquareMatrix3<double>::toQuaternion(in_stack_fffffffffffffd88);
    Quaternion<double>::toTwistSwing
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_RDI,in_RDX);
    Vector3<double>::Vector3((Vector3<double> *)0x2db6c6);
    Vector3<double>::Vector3((Vector3<double> *)0x2db6d5);
    pVar2.second = (double)in_stack_fffffffffffffd08;
    pVar2.first = in_stack_fffffffffffffd10;
    if ((*(uint *)((long)in_RDI + 100) & 4) != 0) {
      local_180 = local_130 - in_RDI[8];
      local_188 = in_RDI[4] * local_180;
      local_148 = in_RDI[4] * 0.5 * local_180 * local_180;
      in_RDI[7] = in_RDI[7] + local_148;
      OpenMD::operator*((double)in_stack_fffffffffffffcd8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffcd0);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      pVar2.second = (double)in_stack_fffffffffffffd08;
      pVar2.first = in_stack_fffffffffffffd10;
      if (((ulong)in_RDI[0xc] & 1) != 0) {
        pVar2 = std::make_pair<double&,double&>
                          (&in_stack_fffffffffffffcd0->first,in_stack_fffffffffffffcc8->data_);
        local_1b4 = 4;
        local_1b0[0] = pVar2;
        pmVar1 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[]((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                               *)pVar2.first,(key_type *)pVar2.second);
        std::pair<double,_double>::operator=(pmVar1,local_1b0);
      }
    }
    pVar3.second = in_stack_fffffffffffffcf0;
    pVar3.first = (double)in_stack_fffffffffffffcf8;
    if ((*(uint *)((long)in_RDI + 100) & 8) != 0) {
      local_1c0 = local_138 - in_RDI[9];
      local_1c8 = in_RDI[5] * local_1c0;
      local_148 = in_RDI[5] * 0.5 * local_1c0 * local_1c0;
      in_RDI[7] = in_RDI[7] + local_148;
      OpenMD::operator*((double)in_stack_fffffffffffffcd8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffcd0);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      pVar3.second = in_stack_fffffffffffffcf0;
      pVar3.first = (double)in_stack_fffffffffffffcf8;
      if (((ulong)in_RDI[0xc] & 1) != 0) {
        pVar3 = std::make_pair<double&,double&>
                          (&in_stack_fffffffffffffcd0->first,in_stack_fffffffffffffcc8->data_);
        local_1f0[0] = pVar3;
        pmVar1 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[]((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                               *)pVar2.first,(key_type *)pVar2.second);
        std::pair<double,_double>::operator=(pmVar1,local_1f0);
      }
    }
    if ((*(uint *)((long)in_RDI + 100) & 0x10) != 0) {
      local_148 = in_RDI[5] * 0.5 * (local_140 - in_RDI[10]) * (local_140 - in_RDI[10]);
      in_RDI[7] = in_RDI[7] + local_148;
      OpenMD::operator*((double)in_stack_fffffffffffffcd8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffcd0);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      if (((ulong)in_RDI[0xc] & 1) != 0) {
        pVar4 = std::make_pair<double&,double&>
                          (&in_stack_fffffffffffffcd0->first,in_stack_fffffffffffffcc8->data_);
        in_stack_fffffffffffffcd8 = (Vector<double,_3U> *)pVar4.second;
        local_230 = pVar4.first;
        in_stack_fffffffffffffcd0 =
             std::
             map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
             ::operator[]((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                           *)pVar2.first,(key_type *)pVar2.second);
        std::pair<double,_double>::operator=(in_stack_fffffffffffffcd0,(type)&local_230);
      }
    }
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)pVar3.first);
    OpenMD::operator*((RectMatrix<double,_3U,_3U> *)pVar3.first,(Vector<double,_3U> *)pVar3.second);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8)
    ;
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2dbb69);
    OpenMD::operator*(in_stack_fffffffffffffcd8,(double)in_stack_fffffffffffffcd0);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffcd8,
               (Vector<double,_3U> *)in_stack_fffffffffffffcd0);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2dbbac);
  }
  return;
}

Assistant:

void ObjectRestraint::calcForce(Vector3d struc, RotMat3x3d A) {
    calcForce(struc);

    // rtDisplacement is 1, rtAbsolute is 2, so anything higher than 3
    // that requires orientations:
    if (restType_ > 3) {
      Vector3d tBody(0.0);

      RotMat3x3d temp = A * refA_.transpose();
      Quat4d quat     = temp.toQuaternion();

      RealType twistAngle;
      RealType swingX, swingY;

      quat.toTwistSwing(twistAngle, swingX, swingY);

      RealType p;
      Vector3d tTwist, tSwing;

      if (restType_ & rtTwist) {
        RealType dTwist = twistAngle - twist0_;
        /// RealType dVdtwist = kTwist_ * sin(dTwist);
        /// p = kTwist_ * (1.0 - cos(dTwist) );
        RealType dVdtwist = kTwist_ * dTwist;
        p                 = 0.5 * kTwist_ * dTwist * dTwist;
        pot_ += p;
        tBody -= dVdtwist * V3Z;

        if (printRest_) restInfo_[rtTwist] = std::make_pair(twistAngle, p);
      }

      if (restType_ & rtSwingX) {
        RealType dSwingX = swingX - swingX0_;
        /// RealType dVdswingX = kSwingX_ * 0.5 * sin(2.0 * dSwingX);
        /// p = 0.25 * kSwingX_ * (1.0 - cos(2.0 * dSwingX));
        RealType dVdswingX = kSwingX_ * dSwingX;
        p                  = 0.5 * kSwingX_ * dSwingX * dSwingX;
        pot_ += p;
        tBody -= dVdswingX * V3X;
        if (printRest_) restInfo_[rtSwingX] = std::make_pair(swingX, p);
      }

      if (restType_ & rtSwingY) {
        RealType dSwingY = swingY - swingY0_;
        /// RealType dVdswingY = kSwingY_ * 0.5 * sin(2.0 * dSwingY);
        /// p = 0.25 * kSwingY_ * (1.0 - cos(2.0 * dSwingY));
        RealType dVdswingY = kSwingY_ * dSwingY;
        p                  = 0.5 * kSwingX_ * dSwingY * dSwingY;
        pot_ += p;
        tBody -= dVdswingY * V3Y;
        if (printRest_) restInfo_[rtSwingY] = std::make_pair(swingY, p);
      }

      Vector3d tLab = A.transpose() * tBody;
      torque_       = tLab * scaleFactor_;
    }
  }